

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void setarg(ident *id,tagval *v)

{
  if (((uint)aliasstack->usedargs >> (id->index & 0x1fU) & 1) != 0) {
    if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
      operator_delete__((id->field_4).args);
    }
    id->field_2 = (anon_union_4_3_c060dbb1_for_ident_2)v->type;
    (id->field_4).val.field_0 = (v->super_identval).field_0;
    cleancode(id);
    return;
  }
  pusharg(id,v,aliasstack->argstack + id->index);
  aliasstack->usedargs = aliasstack->usedargs | 1 << ((byte)id->index & 0x1f);
  return;
}

Assistant:

static inline void setarg(ident &id, tagval &v)
{
    if(aliasstack->usedargs&(1<<id.index))
    {
        if(id.valtype == VAL_STR) delete[] id.val.s;
        id.setval(v);
        cleancode(id);
    }
    else
    {
        pusharg(id, v, aliasstack->argstack[id.index]);
        aliasstack->usedargs |= 1<<id.index;
    }
}